

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u32 tabOpts,Select *pSelect)

{
  i16 iVar1;
  sqlite3 *db_00;
  Table *pTab;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int p3;
  int p2;
  int addr;
  Column *pCVar6;
  char *pcVar7;
  Expr *pEVar8;
  Vdbe *p_00;
  Table *pTable;
  char *pcVar9;
  void *pvVar10;
  Token *local_148;
  Schema *pSchema;
  Table *pOld;
  Db *pDb;
  Token *pEnd2;
  int iCsr;
  Table *pSelTab;
  int addrInsLoop;
  int regRowid;
  int regRec;
  int addrTop;
  int regYield;
  SelectDest dest;
  char *zStmt;
  char *zType2;
  char *zType;
  Vdbe *v;
  int n;
  Expr *pX;
  int local_68;
  u32 colFlags;
  int nNG;
  int ii_1;
  Column *pCol;
  Index *pIStack_50;
  int ii;
  Index *pIdx;
  int iDb;
  sqlite3 *db;
  Table *p;
  Select *pSelect_local;
  u32 tabOpts_local;
  Token *pEnd_local;
  Token *pCons_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if ((pEnd == (Token *)0x0) && (pSelect == (Select *)0x0)) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  if ((pSelect == (Select *)0x0) && (iVar3 = sqlite3ShadowTableName(db_00,pTab->zName), iVar3 != 0))
  {
    pTab->tabFlags = pTab->tabFlags | 0x1000;
  }
  if ((db_00->init).busy != '\0') {
    if ((pSelect != (Select *)0x0) || ((pTab->eTabType != '\0' && ((db_00->init).newTnum != 0)))) {
      sqlite3ErrorMsg(pParse,"");
      return;
    }
    pTab->tnum = (db_00->init).newTnum;
    if (pTab->tnum == 1) {
      pTab->tabFlags = pTab->tabFlags | 1;
    }
  }
  if ((tabOpts & 0x10000) != 0) {
    pTab->tabFlags = pTab->tabFlags | 0x10000;
    for (pCol._4_4_ = 0; pCol._4_4_ < pTab->nCol; pCol._4_4_ = pCol._4_4_ + 1) {
      pCVar6 = pTab->aCol + pCol._4_4_;
      if ((byte)pCVar6->field_0x8 >> 4 == 0) {
        if ((pCVar6->colFlags & 4) != 0) {
          pcVar9 = pTab->zName;
          pcVar2 = pCVar6->zCnName;
          pcVar7 = sqlite3ColumnType(pCVar6,"");
          sqlite3ErrorMsg(pParse,"unknown datatype for %s.%s: \"%s\"",pcVar9,pcVar2,pcVar7);
          return;
        }
        sqlite3ErrorMsg(pParse,"missing datatype for %s.%s",pTab->zName,pCVar6->zCnName);
        return;
      }
      if ((byte)pCVar6->field_0x8 >> 4 == 1) {
        pCVar6->affinity = 'A';
      }
      if ((((pCVar6->colFlags & 1) != 0) && (pTab->iPKey != pCol._4_4_)) &&
         ((pCVar6->field_0x8 & 0xf) == 0)) {
        pCVar6->field_0x8 = pCVar6->field_0x8 & 0xf0 | 2;
        pTab->tabFlags = pTab->tabFlags | 0x800;
      }
    }
  }
  if ((tabOpts & 0x80) != 0) {
    if ((pTab->tabFlags & 8) != 0) {
      sqlite3ErrorMsg(pParse,"AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if ((pTab->tabFlags & 4) == 0) {
      sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
      return;
    }
    pTab->tabFlags = pTab->tabFlags | 0x280;
    convertToWithoutRowidTable(pParse,pTab);
  }
  iVar3 = sqlite3SchemaToIndex(db_00,pTab->pSchema);
  if ((pTab->pCheck != (ExprList *)0x0) &&
     (sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck), pParse->nErr != 0)) {
    sqlite3ExprListDelete(db_00,pTab->pCheck);
    pTab->pCheck = (ExprList *)0x0;
  }
  if ((pTab->tabFlags & 0x60) != 0) {
    local_68 = 0;
    for (colFlags = 0; (int)colFlags < (int)pTab->nCol; colFlags = colFlags + 1) {
      if ((pTab->aCol[(int)colFlags].colFlags & 0x60) == 0) {
        local_68 = local_68 + 1;
      }
      else {
        pEVar8 = sqlite3ColumnExpr(pTab,pTab->aCol + (int)colFlags);
        iVar4 = sqlite3ResolveSelfReference(pParse,pTab,8,pEVar8,(ExprList *)0x0);
        if (iVar4 != 0) {
          pCVar6 = pTab->aCol;
          pEVar8 = sqlite3ExprAlloc(db_00,0x79,(Token *)0x0,0);
          sqlite3ColumnSetExpr(pParse,pTab,pCVar6 + (int)colFlags,pEVar8);
        }
      }
    }
    if (local_68 == 0) {
      sqlite3ErrorMsg(pParse,"must have at least one non-generated column");
      return;
    }
  }
  estimateTableWidth(pTab);
  for (pIStack_50 = pTab->pIndex; pIStack_50 != (Index *)0x0; pIStack_50 = pIStack_50->pNext) {
    estimateIndexWidth(pIStack_50);
  }
  if ((db_00->init).busy == '\0') {
    p_00 = sqlite3GetVdbe(pParse);
    if (p_00 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp1(p_00,0x7a,0);
    if (pTab->eTabType == '\0') {
      zType2 = "table";
      zStmt = "TABLE";
    }
    else {
      zType2 = "view";
      zStmt = "VIEW";
    }
    if (pSelect != (Select *)0x0) {
      if (pParse->eParseMode != '\0') {
        pParse->rc = 1;
        pParse->nErr = pParse->nErr + 1;
        return;
      }
      iVar4 = pParse->nTab;
      pParse->nTab = iVar4 + 1;
      iVar5 = pParse->nMem + 1;
      pParse->nMem = iVar5;
      p3 = pParse->nMem + 1;
      pParse->nMem = p3;
      p2 = pParse->nMem + 1;
      pParse->nMem = p2;
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(p_00,0x71,iVar4,pParse->regRoot,iVar3);
      sqlite3VdbeChangeP5(p_00,0x10);
      addr = sqlite3VdbeCurrentAddr(p_00);
      sqlite3VdbeAddOp3(p_00,0xb,iVar5,0,addr + 1);
      if (pParse->nErr != 0) {
        return;
      }
      pTable = sqlite3ResultSetOfSelect(pParse,pSelect,'A');
      if (pTable == (Table *)0x0) {
        return;
      }
      iVar1 = pTable->nCol;
      pTab->nNVCol = iVar1;
      pTab->nCol = iVar1;
      pTab->aCol = pTable->aCol;
      pTable->nCol = 0;
      pTable->aCol = (Column *)0x0;
      sqlite3DeleteTable(db_00,pTable);
      sqlite3SelectDestInit((SelectDest *)&addrTop,0xd,iVar5);
      sqlite3Select(pParse,pSelect,(SelectDest *)&addrTop);
      if (pParse->nErr != 0) {
        return;
      }
      sqlite3VdbeEndCoroutine(p_00,iVar5);
      sqlite3VdbeJumpHere(p_00,addr);
      iVar5 = sqlite3VdbeAddOp1(p_00,0xc,regYield);
      sqlite3VdbeAddOp3(p_00,0x61,dest.iSDParm,dest.iSDParm2,p3);
      sqlite3TableAffinity(p_00,pTab,0);
      sqlite3VdbeAddOp2(p_00,0x7f,iVar4,p2);
      sqlite3VdbeAddOp3(p_00,0x80,iVar4,p3,p2);
      sqlite3VdbeGoto(p_00,iVar5);
      sqlite3VdbeJumpHere(p_00,iVar5);
      sqlite3VdbeAddOp1(p_00,0x7a,iVar4);
    }
    if (pSelect == (Select *)0x0) {
      local_148 = pEnd;
      if (tabOpts != 0) {
        local_148 = &pParse->sLastToken;
      }
      v._4_4_ = (int)local_148->z - (int)(pParse->sNameToken).z;
      if (*local_148->z != ';') {
        v._4_4_ = local_148->n + v._4_4_;
      }
      dest.pOrderBy =
           (ExprList *)
           sqlite3MPrintf(db_00,"CREATE %s %.*s",zStmt,(ulong)v._4_4_,(pParse->sNameToken).z);
    }
    else {
      dest.pOrderBy = (ExprList *)createTableStmt(db_00,pTab);
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.sqlite_master SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db_00->aDb[iVar3].zDbSName,zType2,pTab->zName,pTab->zName,pParse->regRoot,
                       dest.pOrderBy,pParse->regRowid);
    sqlite3DbFree(db_00,dest.pOrderBy);
    sqlite3ChangeCookie(pParse,iVar3);
    if ((((pTab->tabFlags & 8) != 0) && (pParse->eParseMode == '\0')) &&
       ((db_00->aDb[iVar3].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",
                         db_00->aDb[iVar3].zDbSName);
    }
    pcVar9 = sqlite3MPrintf(db_00,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(p_00,iVar3,pcVar9,0);
    if ((pTab->tabFlags & 0x60) != 0) {
      pcVar9 = sqlite3MPrintf(db_00,"SELECT*FROM\"%w\".\"%w\"",db_00->aDb[iVar3].zDbSName,
                              pTab->zName);
      sqlite3VdbeAddOp4(p_00,0x94,1,0,0,pcVar9,-6);
    }
  }
  if ((db_00->init).busy != '\0') {
    pvVar10 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
    if (pvVar10 != (void *)0x0) {
      sqlite3OomFault(db_00);
      return;
    }
    pParse->pNewTable = (Table *)0x0;
    db_00->mDbFlags = db_00->mDbFlags | 1;
    iVar3 = strcmp(pTab->zName,"sqlite_sequence");
    if (iVar3 == 0) {
      pTab->pSchema->pSeqTab = pTab;
    }
  }
  if ((pSelect == (Select *)0x0) && (pTab->eTabType == '\0')) {
    pEnd_local = pCons;
    if (pCons->z == (char *)0x0) {
      pEnd_local = pEnd;
    }
    (pTab->u).tab.addColOffset = ((int)pEnd_local->z - (int)(pParse->sNameToken).z) + 0xd;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u32 tabOpts,            /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  p = pParse->pNewTable;
  if( p==0 ) return;

  if( pSelect==0 && sqlite3ShadowTableName(db, p->zName) ){
    p->tabFlags |= TF_Shadow;
  }

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_schema" or "sqlite_temp_schema" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_schema
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect || (!IsOrdinaryTable(p) && db->init.newTnum) ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for tables that include the STRICT keyword:
  **
  **   *  Do not allow custom column datatypes.  Every column must have
  **      a datatype that is one of INT, INTEGER, REAL, TEXT, or BLOB.
  **
  **   *  If a PRIMARY KEY is defined, other than the INTEGER PRIMARY KEY,
  **      then all columns of the PRIMARY KEY must have a NOT NULL
  **      constraint.
  */
  if( tabOpts & TF_Strict ){
    int ii;
    p->tabFlags |= TF_Strict;
    for(ii=0; ii<p->nCol; ii++){
      Column *pCol = &p->aCol[ii];
      if( pCol->eCType==COLTYPE_CUSTOM ){
        if( pCol->colFlags & COLFLAG_HASTYPE ){
          sqlite3ErrorMsg(pParse,
            "unknown datatype for %s.%s: \"%s\"",
            p->zName, pCol->zCnName, sqlite3ColumnType(pCol, "")
          );
        }else{
          sqlite3ErrorMsg(pParse, "missing datatype for %s.%s",
                          p->zName, pCol->zCnName);
        }
        return;
      }else if( pCol->eCType==COLTYPE_ANY ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }
      if( (pCol->colFlags & COLFLAG_PRIMKEY)!=0
       && p->iPKey!=ii
       && pCol->notNull == OE_None
      ){
        pCol->notNull = OE_Abort;
        p->tabFlags |= TF_HasNotNull;
      }
    }
  }

  assert( (p->tabFlags & TF_HasPrimaryKey)==0
       || p->iPKey>=0 || sqlite3PrimaryKeyIndex(p)!=0 );
  assert( (p->tabFlags & TF_HasPrimaryKey)!=0
       || (p->iPKey<0 && sqlite3PrimaryKeyIndex(p)==0) );

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
      return;
    }
    p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
    convertToWithoutRowidTable(pParse, p);
  }
  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
    if( pParse->nErr ){
      /* If errors are seen, delete the CHECK constraints now, else they might
      ** actually be used if PRAGMA writable_schema=ON is set. */
      sqlite3ExprListDelete(db, p->pCheck);
      p->pCheck = 0;
    }else{
      markExprListImmutable(p->pCheck);
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  if( p->tabFlags & TF_HasGenerated ){
    int ii, nNG = 0;
    testcase( p->tabFlags & TF_HasVirtual );
    testcase( p->tabFlags & TF_HasStored );
    for(ii=0; ii<p->nCol; ii++){
      u32 colFlags = p->aCol[ii].colFlags;
      if( (colFlags & COLFLAG_GENERATED)!=0 ){
        Expr *pX = sqlite3ColumnExpr(p, &p->aCol[ii]);
        testcase( colFlags & COLFLAG_VIRTUAL );
        testcase( colFlags & COLFLAG_STORED );
        if( sqlite3ResolveSelfReference(pParse, p, NC_GenCol, pX, 0) ){
          /* If there are errors in resolving the expression, change the
          ** expression to a NULL.  This prevents code generators that operate
          ** on the expression from inserting extra parts into the expression
          ** tree that have been allocated from lookaside memory, which is
          ** illegal in a schema and will lead to errors or heap corruption
          ** when the database connection closes. */
          sqlite3ColumnSetExpr(pParse, p, &p->aCol[ii],
               sqlite3ExprAlloc(db, TK_NULL, 0, 0));
        }
      }else{
        nNG++;
      }
    }
    if( nNG==0 ){
      sqlite3ErrorMsg(pParse, "must have at least one non-generated column");
      return;
    }
  }
#endif

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the schema table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /*
    ** Initialize zType for the new view or table.
    */
    if( IsOrdinaryTable(p) ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */
      int iCsr;           /* Write cursor on the new table */

      if( IN_SPECIAL_PARSE ){
        pParse->rc = SQLITE_ERROR;
        pParse->nErr++;
        return;
      }
      iCsr = pParse->nTab++;
      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, iCsr, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect, SQLITE_AFF_BLOB);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = p->nNVCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iCsr, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iCsr, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, iCsr);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db,
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the
    ** schema table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE
      " SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q"
      " WHERE rowid=#%d",
      db->aDb[iDb].zDbSName,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 && !IN_SPECIAL_PARSE ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName),0);

    /* Test for cycles in generated columns and illegal expressions
    ** in CHECK constraints and in DEFAULT clauses. */
    if( p->tabFlags & TF_HasGenerated ){
      sqlite3VdbeAddOp4(v, OP_SqlExec, 0x0001, 0, 0,
             sqlite3MPrintf(db, "SELECT*FROM\"%w\".\"%w\"",
                   db->aDb[iDb].zDbSName, p->zName), P4_DYNAMIC);
    }
  }

  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    assert( HasRowid(p) || p->iPKey<0 );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

    /* If this is the magic sqlite_sequence table used by autoincrement,
    ** then record a pointer to this table in the main database structure
    ** so that INSERT can find the table easily.  */
    assert( !pParse->nested );
#ifndef SQLITE_OMIT_AUTOINCREMENT
    if( strcmp(p->zName, "sqlite_sequence")==0 ){
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      p->pSchema->pSeqTab = p;
    }
#endif
  }

#ifndef SQLITE_OMIT_ALTERTABLE
  if( !pSelect && IsOrdinaryTable(p) ){
    assert( pCons && pEnd );
    if( pCons->z==0 ){
      pCons = pEnd;
    }
    p->u.tab.addColOffset = 13 + (int)(pCons->z - pParse->sNameToken.z);
  }
#endif
}